

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttc0_vpecontrol_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  CPUMIPSState_conflict5 *pCVar1;
  uint32_t newval;
  uint32_t mask;
  CPUMIPSState_conflict5 *other;
  target_ulong tStack_18;
  int other_tc;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  tStack_18 = arg1;
  arg1_local = (target_ulong)env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  pCVar1->CP0_VPEControl = pCVar1->CP0_VPEControl & 0xffcf7f00U | (uint)tStack_18 & 0x3080ff;
  return;
}

Assistant:

void helper_mttc0_vpecontrol(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);
    uint32_t mask;
    uint32_t newval;

    mask = (1 << CP0VPECo_YSI) | (1 << CP0VPECo_GSI) |
           (1 << CP0VPECo_TE) | (0xff << CP0VPECo_TargTC);
    newval = (other->CP0_VPEControl & ~mask) | (arg1 & mask);

    /* TODO: Enable/disable TCs.  */

    other->CP0_VPEControl = newval;
}